

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day04b.cpp
# Opt level: O1

int day4b::northpole_room_id(string *input)

{
  long *__nptr;
  istream *piVar1;
  int *piVar2;
  long lVar3;
  undefined8 uVar4;
  ulong uVar5;
  int unaff_EBP;
  int iVar6;
  int iVar7;
  string name;
  string line;
  istringstream stream;
  long *local_218;
  ulong local_210;
  long local_208 [2];
  undefined1 *local_1f8;
  long local_1f0;
  undefined1 local_1e8;
  undefined7 uStack_1e7;
  long *local_1d8 [2];
  long local_1c8 [2];
  long *local_1b8;
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  std::__cxx11::istringstream::istringstream(local_1b0,(string *)input,_S_in);
  local_1f8 = &local_1e8;
  local_1f0 = 0;
  local_1e8 = 0;
  do {
    piVar1 = std::operator>>((istream *)local_1b0,(string *)&local_1f8);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) {
      unaff_EBP = 0;
      break;
    }
    local_218 = local_208;
    std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((string *)&local_218,local_1f8,local_1f8 + local_1f0 + -0xb);
    local_1d8[0] = local_1c8;
    std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((string *)local_1d8,local_1f8 + local_1f0 + -10,local_1f8 + local_1f0 + -7);
    __nptr = local_1d8[0];
    piVar2 = __errno_location();
    iVar7 = *piVar2;
    *piVar2 = 0;
    lVar3 = strtol((char *)__nptr,(char **)&local_1b8,10);
    if (local_1b8 == __nptr) {
      std::__throw_invalid_argument("stoi");
LAB_00109413:
      uVar4 = std::__throw_out_of_range("stoi");
      if (local_1f8 != &local_1e8) {
        operator_delete(local_1f8,CONCAT71(uStack_1e7,local_1e8) + 1);
      }
      std::__cxx11::istringstream::~istringstream(local_1b0);
      std::ios_base::~ios_base(local_138);
      _Unwind_Resume(uVar4);
    }
    iVar6 = (int)lVar3;
    if ((iVar6 != lVar3) || (*piVar2 == 0x22)) goto LAB_00109413;
    if (*piVar2 == 0) {
      *piVar2 = iVar7;
    }
    if (local_1d8[0] != local_1c8) {
      operator_delete(local_1d8[0],local_1c8[0] + 1);
    }
    if (local_210 != 0) {
      uVar5 = 0;
      do {
        if (*(char *)((long)local_218 + uVar5) != 0x2d) {
          iVar7 = (int)*(char *)((long)local_218 + uVar5) + iVar6 + -0x61;
          *(char *)((long)local_218 + uVar5) =
               (char)iVar7 +
               ((char)(uint)((ulong)((long)iVar7 * 0x4ec4ec4f) >> 0x23) - (char)(iVar7 >> 0x1f)) *
               -0x1a + 'a';
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < local_210);
    }
    iVar7 = std::__cxx11::string::compare((char *)&local_218);
    if (iVar7 == 0) {
      unaff_EBP = iVar6;
    }
    if (local_218 != local_208) {
      operator_delete(local_218,local_208[0] + 1);
    }
  } while (iVar7 != 0);
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8,CONCAT71(uStack_1e7,local_1e8) + 1);
  }
  std::__cxx11::istringstream::~istringstream(local_1b0);
  std::ios_base::~ios_base(local_138);
  return unaff_EBP;
}

Assistant:

int northpole_room_id(const std::string& input) {
		std::istringstream stream(input);
		std::string line;
		while(stream >> line) {
			std::string name{line.begin(), line.end() - 11};
			int id = std::stoi(std::string{line.end() - 10, line.end() - 7});
			decipher_name(name, id);
			if(name == "northpole-object-storage") {
				return id;
			}
		}
		return 0;
	}